

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void packforblock11(uint32_t base,uint32_t **pin,uint8_t **pw)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  ulong *puVar28;
  uint32_t *puVar29;
  
  puVar28 = (ulong *)*pw;
  puVar29 = *pin;
  uVar1 = puVar29[5];
  uVar2 = puVar29[6];
  uVar3 = puVar29[7];
  uVar4 = puVar29[8];
  uVar5 = puVar29[9];
  uVar6 = puVar29[10];
  uVar7 = puVar29[0xb];
  uVar8 = puVar29[0xc];
  uVar9 = puVar29[0xd];
  uVar10 = puVar29[0xe];
  uVar11 = puVar29[0xf];
  uVar12 = puVar29[0x10];
  uVar13 = puVar29[0x11];
  uVar14 = puVar29[0x12];
  uVar15 = puVar29[0x13];
  uVar16 = puVar29[0x14];
  uVar17 = puVar29[0x15];
  uVar18 = puVar29[0x16];
  uVar19 = puVar29[0x17];
  uVar20 = puVar29[0x18];
  uVar21 = puVar29[0x19];
  uVar22 = puVar29[0x1a];
  uVar23 = puVar29[0x1b];
  uVar24 = puVar29[0x1c];
  uVar25 = puVar29[0x1d];
  uVar26 = puVar29[0x1e];
  uVar27 = puVar29[0x1f];
  *puVar28 = (ulong)(uVar1 - base) << 0x37 | (ulong)(puVar29[4] - base) << 0x2c |
             (ulong)(puVar29[3] - base) << 0x21 | (ulong)(puVar29[2] - base) << 0x16 |
             (ulong)(puVar29[1] - base) << 0xb | (ulong)(*puVar29 - base);
  puVar28[1] = (ulong)(uVar7 - base) << 0x39 |
               (ulong)(uVar6 - base) << 0x2e | (ulong)(uVar5 - base) << 0x23 |
               (ulong)(uVar4 - base) << 0x18 | (ulong)(uVar3 - base) << 0xd |
               (ulong)(uVar2 - base) << 2 | (ulong)(uVar1 - base >> 9);
  puVar28[2] = (ulong)(uVar13 - base) << 0x3b |
               (ulong)(uVar12 - base) << 0x30 | (ulong)(uVar11 - base) << 0x25 |
               (ulong)(uVar10 - base) << 0x1a | (ulong)(uVar9 - base) << 0xf |
               (ulong)(uVar8 - base) << 4 | (ulong)(uVar7 - base >> 7);
  puVar28[3] = (ulong)(uVar19 - base) << 0x3d |
               (ulong)(uVar18 - base) << 0x32 | (ulong)(uVar17 - base) << 0x27 |
               (ulong)(uVar16 - base) << 0x1c | (ulong)(uVar15 - base) << 0x11 |
               (ulong)(uVar14 - base) << 6 | (ulong)(uVar13 - base >> 5);
  puVar28[4] = (ulong)(uVar25 - base) << 0x3f |
               (ulong)(uVar24 - base) << 0x34 | (ulong)(uVar23 - base) << 0x29 |
               (ulong)(uVar22 - base) << 0x1e | (ulong)(uVar21 - base) << 0x13 |
               (ulong)(uVar20 - base) << 8 | (ulong)(uVar19 - base >> 3);
  puVar28[5] = (ulong)(uVar27 - base) << 0x15 |
               (ulong)(uVar26 - base) << 10 | (ulong)(uVar25 - base >> 1);
  *pin = puVar29 + 0x20;
  *pw = *pw + 0x2c;
  return;
}

Assistant:

static void packforblock11(const uint32_t base, const uint32_t **pin,
                           uint8_t **pw) {
  uint64_t *pw64 = *(uint64_t **)pw;
  const uint32_t *in = *pin;
  /* we are going to touch  6 64-bit words */
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  w0 = (uint64_t)(in[0] - base);
  w0 |= (uint64_t)(in[1] - base) << 11;
  w0 |= (uint64_t)(in[2] - base) << 22;
  w0 |= (uint64_t)(in[3] - base) << 33;
  w0 |= (uint64_t)(in[4] - base) << 44;
  w0 |= (uint64_t)(in[5] - base) << 55;
  w1 = (uint64_t)(in[5] - base) >> 9;
  w1 |= (uint64_t)(in[6] - base) << 2;
  w1 |= (uint64_t)(in[7] - base) << 13;
  w1 |= (uint64_t)(in[8] - base) << 24;
  w1 |= (uint64_t)(in[9] - base) << 35;
  w1 |= (uint64_t)(in[10] - base) << 46;
  w1 |= (uint64_t)(in[11] - base) << 57;
  w2 = (uint64_t)(in[11] - base) >> 7;
  w2 |= (uint64_t)(in[12] - base) << 4;
  w2 |= (uint64_t)(in[13] - base) << 15;
  w2 |= (uint64_t)(in[14] - base) << 26;
  w2 |= (uint64_t)(in[15] - base) << 37;
  w2 |= (uint64_t)(in[16] - base) << 48;
  w2 |= (uint64_t)(in[17] - base) << 59;
  w3 = (uint64_t)(in[17] - base) >> 5;
  w3 |= (uint64_t)(in[18] - base) << 6;
  w3 |= (uint64_t)(in[19] - base) << 17;
  w3 |= (uint64_t)(in[20] - base) << 28;
  w3 |= (uint64_t)(in[21] - base) << 39;
  w3 |= (uint64_t)(in[22] - base) << 50;
  w3 |= (uint64_t)(in[23] - base) << 61;
  w4 = (uint64_t)(in[23] - base) >> 3;
  w4 |= (uint64_t)(in[24] - base) << 8;
  w4 |= (uint64_t)(in[25] - base) << 19;
  w4 |= (uint64_t)(in[26] - base) << 30;
  w4 |= (uint64_t)(in[27] - base) << 41;
  w4 |= (uint64_t)(in[28] - base) << 52;
  w4 |= (uint64_t)(in[29] - base) << 63;
  w5 = (uint64_t)(in[29] - base) >> 1;
  w5 |= (uint64_t)(in[30] - base) << 10;
  w5 |= (uint64_t)(in[31] - base) << 21;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  *pin += 32; /* we consumed 32 32-bit integers */
  *pw += 44;  /* we used up 44 output bytes */
}